

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqllogictest.cpp
# Opt level: O1

void testRunner<false,true>(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  IResultCapture *pIVar4;
  undefined8 *puVar5;
  long lVar6;
  InvalidInputException *this;
  long *plVar7;
  long *plVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> test_working_dir;
  string prev_directory;
  string initial_dbpath;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  SQLLogicTestRunner runner;
  long *local_428;
  long local_420;
  long local_418;
  long lStack_410;
  string local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3c8;
  size_type local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  undefined1 *local_2e8 [2];
  undefined1 local_2d8 [16];
  undefined1 *local_2c8 [2];
  undefined1 local_2b8 [16];
  undefined1 *local_2a8 [2];
  undefined1 local_298 [16];
  SQLLogicTestRunner local_288;
  
  pIVar4 = Catch::getResultCapture();
  (*pIVar4->_vptr_IResultCapture[0x15])(&local_3a8,pIVar4);
  local_3c0 = 0;
  local_3b8._M_local_buf[0] = '\0';
  local_3c8 = &local_3b8;
  bVar3 = duckdb::TestForceStorage();
  if (bVar3) {
    local_2a8[0] = local_298;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2a8,local_3a8._M_dataplus._M_p,
               local_3a8._M_dataplus._M_p + local_3a8._M_string_length);
    paVar1 = &local_408.field_2;
    local_408._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"/","");
    local_428 = &local_418;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"_","");
    duckdb::StringUtil::Replace(&local_288,local_2a8,&local_408,&local_428);
    if (local_428 != &local_418) {
      operator_delete(local_428);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != paVar1) {
      operator_delete(local_408._M_dataplus._M_p);
    }
    if (local_2a8[0] != local_298) {
      operator_delete(local_2a8[0]);
    }
    local_2c8[0] = local_2b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2c8,local_288._vptr_SQLLogicTestRunner,
               local_288.dbpath._M_dataplus._M_p + (long)local_288._vptr_SQLLogicTestRunner);
    local_428 = &local_418;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,".","");
    paVar2 = &local_3e8.field_2;
    local_3e8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"_","");
    duckdb::StringUtil::Replace(&local_408,local_2c8,&local_428,&local_3e8);
    std::__cxx11::string::operator=((string *)&local_288,(string *)&local_408);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != paVar1) {
      operator_delete(local_408._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != paVar2) {
      operator_delete(local_3e8._M_dataplus._M_p);
    }
    if (local_428 != &local_418) {
      operator_delete(local_428);
    }
    if (local_2c8[0] != local_2b8) {
      operator_delete(local_2c8[0]);
    }
    local_2e8[0] = local_2d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2e8,local_288._vptr_SQLLogicTestRunner,
               local_288.dbpath._M_dataplus._M_p + (long)local_288._vptr_SQLLogicTestRunner);
    local_428 = &local_418;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"\\","");
    local_3e8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"_","");
    duckdb::StringUtil::Replace(&local_408,local_2e8,&local_428,&local_3e8);
    std::__cxx11::string::operator=((string *)&local_288,(string *)&local_408);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != paVar1) {
      operator_delete(local_408._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != paVar2) {
      operator_delete(local_3e8._M_dataplus._M_p);
    }
    if (local_428 != &local_418) {
      operator_delete(local_428);
    }
    if (local_2e8[0] != local_2d8) {
      operator_delete(local_2e8[0]);
    }
    local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_388,local_288._vptr_SQLLogicTestRunner,
               local_288.dbpath._M_dataplus._M_p + (long)local_288._vptr_SQLLogicTestRunner);
    std::__cxx11::string::append((char *)&local_388);
    duckdb::TestCreatePath(&local_408,&local_388);
    std::__cxx11::string::operator=((string *)&local_3c8,(string *)&local_408);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != paVar1) {
      operator_delete(local_408._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2) {
      operator_delete(local_388._M_dataplus._M_p);
    }
    if (local_288._vptr_SQLLogicTestRunner != (_func_int **)&local_288.dbpath._M_string_length) {
      operator_delete(local_288._vptr_SQLLogicTestRunner);
    }
  }
  if (local_3c8 == &local_3b8) {
    local_368.field_2._8_8_ = local_3b8._8_8_;
    local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  }
  else {
    local_368._M_dataplus._M_p = (pointer)local_3c8;
  }
  local_368.field_2._M_allocated_capacity._1_7_ = local_3b8._M_allocated_capacity._1_7_;
  local_368.field_2._M_local_buf[0] = local_3b8._M_local_buf[0];
  local_368._M_string_length = local_3c0;
  local_3c0 = 0;
  local_3b8._M_local_buf[0] = '\0';
  local_3c8 = &local_3b8;
  duckdb::SQLLogicTestRunner::SQLLogicTestRunner(&local_288,&local_368);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p);
  }
  if (Catch::IMutableContext::currentContext == (long *)0x0) {
    Catch::IMutableContext::createContext();
  }
  puVar5 = (undefined8 *)(**(code **)(*Catch::IMutableContext::currentContext + 0x20))();
  local_288.output_sql = (bool)(**(code **)(*(long *)*puVar5 + 0xb8))();
  local_288.enable_verification = false;
  local_408._M_string_length = 0;
  local_408.field_2._M_local_buf[0] = '\0';
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  duckdb::TestGetCurrentDirectory_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&local_408,(string *)&local_428);
  if (local_428 != &local_418) {
    operator_delete(local_428);
  }
  lVar6 = std::__cxx11::string::rfind((char *)&local_3a8,0x4f8604,0xffffffffffffffff);
  if (lVar6 != -1) {
    std::__cxx11::string::substr((ulong)&local_428,(ulong)&local_3a8);
    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_308,local_428,local_420 + (long)local_428);
    duckdb::TestChangeDirectory(&local_308);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p);
    }
    if (local_428 != &local_418) {
      operator_delete(local_428);
    }
    local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_328,local_3a8._M_dataplus._M_p,
               local_3a8._M_dataplus._M_p + local_3a8._M_string_length);
    duckdb::SQLLogicTestRunner::ExecuteFile(&local_288,&local_328);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p);
    }
    local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_348,local_408._M_dataplus._M_p,
               local_408._M_dataplus._M_p + local_408._M_string_length);
    duckdb::TestChangeDirectory(&local_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p);
    }
    duckdb::ClearTestDirectory();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != &local_408.field_2) {
      operator_delete(local_408._M_dataplus._M_p);
    }
    duckdb::SQLLogicTestRunner::~SQLLogicTestRunner(&local_288);
    if (local_3c8 != &local_3b8) {
      operator_delete(local_3c8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p);
    }
    return;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  std::operator+(&local_3e8,"Failed to auto detect working dir for test \'",&local_3a8);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_3e8);
  local_428 = (long *)*plVar7;
  plVar8 = plVar7 + 2;
  if (local_428 == plVar8) {
    local_418 = *plVar8;
    lStack_410 = plVar7[3];
    local_428 = &local_418;
  }
  else {
    local_418 = *plVar8;
  }
  local_420 = plVar7[1];
  *plVar7 = (long)plVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  duckdb::InvalidInputException::InvalidInputException(this,(string *)&local_428);
  __cxa_throw(this,&duckdb::InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void testRunner() {
	// this is an ugly hack that uses the test case name to pass the script file
	// name if someone has a better idea...
	auto name = Catch::getResultCapture().getCurrentTestName();
	// fprintf(stderr, "%s\n", name.c_str());
	string initial_dbpath;
	if (TestForceStorage()) {
		auto storage_name = StringUtil::Replace(name, "/", "_");
		storage_name = StringUtil::Replace(storage_name, ".", "_");
		storage_name = StringUtil::Replace(storage_name, "\\", "_");
		initial_dbpath = TestCreatePath(storage_name + ".db");
	}
	SQLLogicTestRunner runner(std::move(initial_dbpath));
	runner.output_sql = Catch::getCurrentContext().getConfig()->outputSQL();
	runner.enable_verification = VERIFICATION;

	string prev_directory;

	// We assume the test working dir for extensions to be one dir above the test/sql. Note that this is very hacky.
	// however for now it suffices: we use it to run tests from out-of-tree extensions that are based on the extension
	// template which adheres to this convention.
	if (AUTO_SWITCH_TEST_DIR) {
		prev_directory = TestGetCurrentDirectory();

		std::size_t found = name.rfind("test/sql");
		if (found == std::string::npos) {
			throw InvalidInputException("Failed to auto detect working dir for test '" + name +
			                            "' because a non-standard path was used!");
		}
		auto test_working_dir = name.substr(0, found);

		// Parse the test dir automatically
		TestChangeDirectory(test_working_dir);
	}

	runner.ExecuteFile(name);

	if (AUTO_SWITCH_TEST_DIR) {
		TestChangeDirectory(prev_directory);
	}

	// clear test directory after running tests
	ClearTestDirectory();
}